

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O1

void __thiscall Analyzer::removeNearestAssignmentsFoundAt(Analyzer *this,Node *node)

{
  Node *a;
  bool bVar1;
  pointer ppNVar2;
  ulong uVar3;
  long lVar4;
  
  if ((node != (Node *)0x0) &&
     (nearest_assignments.
      super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      nearest_assignments.
      super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    if (nearest_assignments.
        super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        nearest_assignments.
        super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        a = *(Node **)((long)&(nearest_assignments.
                               super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first + lVar4);
        if ((a != (Node *)0x0) && (bVar1 = isNodeEquals(this,a,node), bVar1)) {
          *(undefined8 *)
           ((long)&(nearest_assignments.
                    super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->first + lVar4) = 0;
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x18;
      } while (uVar3 < (ulong)(((long)nearest_assignments.
                                      super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)nearest_assignments.
                                      super__Vector_base<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
    }
    ppNVar2 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppNVar2) {
      uVar3 = 0;
      do {
        removeNearestAssignmentsFoundAt(this,ppNVar2[uVar3]);
        uVar3 = uVar3 + 1;
        ppNVar2 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar3 < (ulong)((long)(node->children).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3));
    }
  }
  return;
}

Assistant:

void removeNearestAssignmentsFoundAt(Node * node)
  {
    if (!nearest_assignments.size() || !node)
      return;

    for (size_t i = 0; i < nearest_assignments.size(); i++)
      if (nearest_assignments[i].first)
        if (isNodeEquals(nearest_assignments[i].first, node))
          nearest_assignments[i].first = nullptr;

    for (size_t i = 0; i < node->children.size(); i++)
      removeNearestAssignmentsFoundAt(node->children[i]);
  }